

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O0

bool ImGui::InvisibleButton(char *str_id,ImVec2 *size_arg,ImGuiButtonFlags flags)

{
  ImGuiWindow *pIVar1;
  undefined8 *in_RSI;
  undefined8 in_RDI;
  ImVec2 IVar2;
  bool *unaff_retaddr;
  ImGuiID in_stack_0000000c;
  bool pressed;
  bool held;
  ImRect *in_stack_00000010;
  bool hovered;
  ImRect bb;
  ImVec2 size;
  ImGuiID id;
  ImGuiWindow *window;
  ImGuiContext *g;
  ImVec2 *in_stack_ffffffffffffff88;
  ImVec2 in_stack_ffffffffffffffa0;
  float extra_flags;
  float in_stack_ffffffffffffffa8;
  float in_stack_ffffffffffffffac;
  float in_stack_ffffffffffffffb0;
  float in_stack_ffffffffffffffb4;
  ImRect *bb_00;
  ImGuiButtonFlags flags_00;
  undefined7 in_stack_fffffffffffffff8;
  undefined1 in_stack_ffffffffffffffff;
  bool bVar3;
  
  flags_00 = (ImGuiButtonFlags)((ulong)in_RDI >> 0x20);
  pIVar1 = GetCurrentWindow();
  if ((pIVar1->SkipItems & 1U) == 0) {
    ImGuiWindow::GetID((ImGuiWindow *)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),
                       (char *)CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8),
                       (char *)in_stack_ffffffffffffffa0);
    bb_00 = (ImRect *)*in_RSI;
    IVar2.y = in_stack_ffffffffffffffac;
    IVar2.x = in_stack_ffffffffffffffa8;
    CalcItemSize(IVar2,in_stack_ffffffffffffffa0.y,in_stack_ffffffffffffffa0.x);
    IVar2 = ::operator+(in_stack_ffffffffffffff88,(ImVec2 *)0x4e7e39);
    extra_flags = IVar2.y;
    ImRect::ImRect((ImRect *)&stack0xffffffffffffffa8,&(pIVar1->DC).CursorPos,
                   (ImVec2 *)&stack0xffffffffffffffa0);
    ItemSize((ImVec2 *)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),
             in_stack_ffffffffffffffac);
    bVar3 = ItemAdd(bb_00,(ImGuiID)in_stack_ffffffffffffffb4,
                    (ImRect *)CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8),
                    (ImGuiItemFlags)extra_flags);
    if (bVar3) {
      bVar3 = ButtonBehavior(in_stack_00000010,in_stack_0000000c,unaff_retaddr,
                             (bool *)CONCAT17(in_stack_ffffffffffffffff,in_stack_fffffffffffffff8),
                             flags_00);
    }
    else {
      bVar3 = false;
    }
  }
  else {
    bVar3 = false;
  }
  return bVar3;
}

Assistant:

bool ImGui::InvisibleButton(const char* str_id, const ImVec2& size_arg, ImGuiButtonFlags flags)
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = GetCurrentWindow();
    if (window->SkipItems)
        return false;

    // Cannot use zero-size for InvisibleButton(). Unlike Button() there is not way to fallback using the label size.
    IM_ASSERT(size_arg.x != 0.0f && size_arg.y != 0.0f);

    const ImGuiID id = window->GetID(str_id);
    ImVec2 size = CalcItemSize(size_arg, 0.0f, 0.0f);
    const ImRect bb(window->DC.CursorPos, window->DC.CursorPos + size);
    ItemSize(size);
    if (!ItemAdd(bb, id))
        return false;

    bool hovered, held;
    bool pressed = ButtonBehavior(bb, id, &hovered, &held, flags);

    IMGUI_TEST_ENGINE_ITEM_INFO(id, str_id, g.LastItemData.StatusFlags);
    return pressed;
}